

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void tcg_out_setcond32(TCGContext_conflict9 *s,TCGCond cond,TCGArg dest,TCGArg arg1,TCGArg arg2,
                      int const_arg2)

{
  int rm;
  int const_arg2_local;
  TCGArg arg2_local;
  TCGArg arg1_local;
  TCGArg dest_local;
  TCGCond cond_local;
  TCGContext_conflict9 *s_local;
  
  tcg_out_cmp(s,arg1,arg2,const_arg2,0);
  rm = (int)dest;
  tcg_out_modrm(s,""[cond] | 0x4190,0,rm);
  tcg_out_ext8u(s,rm,rm);
  return;
}

Assistant:

static void tcg_out_setcond32(TCGContext *s, TCGCond cond, TCGArg dest,
                              TCGArg arg1, TCGArg arg2, int const_arg2)
{
    tcg_out_cmp(s, arg1, arg2, const_arg2, 0);
    tcg_out_modrm(s, OPC_SETCC | tcg_cond_to_jcc[cond], 0, dest);
    tcg_out_ext8u(s, dest, dest);
}